

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TableUpdateDrawChannels(ImGuiTable *table)

{
  char cVar1;
  ImGuiTableColumn *pIVar2;
  ImS8 IVar3;
  ImS8 IVar5;
  int column_n;
  int iVar6;
  char cVar7;
  int iVar8;
  bool bVar9;
  int iVar4;
  
  cVar7 = '\x01';
  iVar8 = 1;
  if ((table->Flags & 0x4000) == 0) {
    iVar8 = table->ColumnsVisibleCount;
  }
  bVar9 = true;
  if (table->ColumnsCount <= table->ColumnsVisibleCount) {
    bVar9 = table->VisibleUnclippedMaskByIndex != table->VisibleMaskByIndex;
  }
  iVar6 = iVar8 << ('\0' < table->FreezeRowsCount);
  ImDrawListSplitter::Split
            (&table->DrawSplitter,table->InnerWindow->DrawList,iVar6 + (uint)bVar9 + 1);
  cVar1 = -1;
  if (bVar9 != false) {
    cVar1 = (char)iVar6 + bVar9;
  }
  table->DummyDrawChannel = cVar1;
  for (iVar6 = 0; iVar6 < table->ColumnsCount; iVar6 = iVar6 + 1) {
    pIVar2 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,iVar6);
    if (pIVar2->IsClipped == false) {
      iVar4 = 0;
      if ('\0' < table->FreezeRowsCount) {
        iVar4 = iVar8;
      }
      IVar3 = (char)iVar4 + cVar7;
      IVar5 = cVar7;
      cVar7 = cVar7 + ((table->Flags & 0x4000) == 0);
    }
    else {
      IVar3 = table->DummyDrawChannel;
      IVar5 = IVar3;
    }
    pIVar2->DrawChannelRowsAfterFreeze = IVar3;
    pIVar2->DrawChannelRowsBeforeFreeze = IVar5;
    pIVar2->DrawChannelCurrent = IVar5;
  }
  return;
}

Assistant:

void ImGui::TableUpdateDrawChannels(ImGuiTable* table)
{
    // Allocate draw channels.
    // - We allocate them following storage order instead of display order so reordering columns won't needlessly
    //   increase overall dormant memory cost.
    // - We isolate headers draw commands in their own channels instead of just altering clip rects.
    //   This is in order to facilitate merging of draw commands.
    // - After crossing FreezeRowsCount, all columns see their current draw channel changed to a second set of channels.
    // - We only use the dummy draw channel so we can push a null clipping rectangle into it without affecting other
    //   channels, while simplifying per-row/per-cell overhead. It will be empty and discarded when merged.
    // Draw channel allocation (before merging):
    // - NoClip                       --> 1+1 channels: background + foreground (same clip rect == 1 draw call)
    // - Clip                         --> 1+N channels
    // - FreezeRows || FreezeColumns  --> 1+N*2 (unless scrolling value is zero)
    // - FreezeRows && FreezeColunns  --> 2+N*2 (unless scrolling value is zero)
    const int freeze_row_multiplier = (table->FreezeRowsCount > 0) ? 2 : 1;
    const int channels_for_row = (table->Flags & ImGuiTableFlags_NoClipX) ? 1 : table->ColumnsVisibleCount;
    const int channels_for_background = 1;
    const int channels_for_dummy = (table->ColumnsVisibleCount < table->ColumnsCount || table->VisibleUnclippedMaskByIndex != table->VisibleMaskByIndex) ? +1 : 0;
    const int channels_total = channels_for_background + (channels_for_row * freeze_row_multiplier) + channels_for_dummy;
    table->DrawSplitter.Split(table->InnerWindow->DrawList, channels_total);
    table->DummyDrawChannel = channels_for_dummy ? (ImS8)(channels_total - 1) : -1;

    int draw_channel_current = 1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsClipped)
        {
            column->DrawChannelRowsBeforeFreeze = (ImS8)(draw_channel_current);
            column->DrawChannelRowsAfterFreeze = (ImS8)(draw_channel_current + (table->FreezeRowsCount > 0 ? channels_for_row : 0));
            if (!(table->Flags & ImGuiTableFlags_NoClipX))
                draw_channel_current++;
        }
        else
        {
            column->DrawChannelRowsBeforeFreeze = column->DrawChannelRowsAfterFreeze = table->DummyDrawChannel;
        }
        column->DrawChannelCurrent = column->DrawChannelRowsBeforeFreeze;
    }
}